

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O1

int lencode_order(lua_State *L)

{
  uint8_t *puVar1;
  uint uVar2;
  char *key;
  void *__dest;
  long lVar3;
  int iVar4;
  size_t sVar5;
  size_t __n;
  bson b;
  bson local_90;
  size_t local_40;
  size_t local_38;
  
  puVar1 = local_90.buffer;
  local_90.size = 0;
  local_90.cap = 0x40;
  local_90.ptr = puVar1;
  uVar2 = lua_gettop(L);
  if ((uVar2 & 1) == 0) {
    sVar5 = (size_t)local_90.size;
    if (local_90.cap < local_90.size + 4) {
      do {
        local_90.cap = local_90.cap * 2;
      } while (local_90.cap <= local_90.size + 4);
      if (local_90.ptr == puVar1) {
        local_90.ptr = (uint8_t *)malloc((long)local_90.cap);
        memcpy(local_90.ptr,puVar1,sVar5);
      }
      else {
        local_90.ptr = (uint8_t *)realloc(local_90.ptr,(long)local_90.cap);
      }
    }
    iVar4 = local_90.size + 4;
    local_40 = sVar5;
    local_90.size = iVar4;
    if (0 < (int)uVar2) {
      iVar4 = 0;
      do {
        key = lua_tolstring(L,iVar4 + 1U,&local_38);
        if (key == (char *)0x0) {
          luaL_error(L,"Argument %d need a string",(ulong)(iVar4 + 1U));
        }
        iVar4 = iVar4 + 2;
        lua_pushvalue(L,iVar4);
        append_one(&local_90,L,key,local_38);
        lua_settop(L,-2);
      } while (iVar4 < (int)uVar2);
    }
    sVar5 = local_40;
    __n = (size_t)local_90.size;
    puVar1 = local_90.buffer;
    if (local_90.cap <= local_90.size) {
      do {
        local_90.cap = local_90.cap * 2;
      } while (local_90.cap <= local_90.size + 1);
      if (local_90.ptr == puVar1) {
        local_90.ptr = (uint8_t *)malloc((long)local_90.cap);
        memcpy(local_90.ptr,puVar1,__n);
      }
      else {
        local_90.ptr = (uint8_t *)realloc(local_90.ptr,(long)local_90.cap);
      }
    }
    lVar3 = (long)local_90.size;
    local_90.size = local_90.size + 1;
    local_90.ptr[lVar3] = '\0';
    iVar4 = local_90.size - (int)sVar5;
    local_90.ptr[sVar5] = (uint8_t)iVar4;
    local_90.ptr[sVar5 + 1] = (uint8_t)((uint)iVar4 >> 8);
    local_90.ptr[sVar5 + 2] = (uint8_t)((uint)iVar4 >> 0x10);
    local_90.ptr[sVar5 + 3] = (uint8_t)((uint)iVar4 >> 0x18);
    iVar4 = 1;
    lua_settop(L,1);
    __dest = lua_newuserdata(L,(long)local_90.size);
    memcpy(__dest,local_90.ptr,(long)local_90.size);
    if (local_90.ptr != puVar1) {
      free(local_90.ptr);
    }
    bson_meta(L);
  }
  else {
    iVar4 = luaL_error(L,"Invalid ordered dict");
  }
  return iVar4;
}

Assistant:

static int
lencode_order(lua_State *L) {
	struct bson b;
	bson_create(&b);
	int n = lua_gettop(L);
	if (n%2 != 0) {
		return luaL_error(L, "Invalid ordered dict");
	}
	pack_ordered_dict(L, &b, n);
	lua_settop(L,1);
	void * ud = lua_newuserdata(L, b.size);
	memcpy(ud, b.ptr, b.size);
	bson_destroy(&b);
	bson_meta(L);
	return 1;
}